

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::AddSymbol
          (DescriptorBuilder *this,string *full_name,void *parent,string *name,Message *proto,
          Symbol symbol)

{
  char *__s1;
  _Node **pp_Var1;
  ulong uVar2;
  DescriptorBuilder *this_00;
  bool bVar3;
  int iVar4;
  LogMessage *pLVar5;
  ulong uVar6;
  FileDescriptor *pFVar7;
  long *plVar8;
  long lVar9;
  undefined8 *puVar10;
  Symbol *pSVar11;
  ulong *puVar12;
  size_type *psVar13;
  char cVar14;
  _Node *p_Var15;
  char *pcVar16;
  _Node *p_Var17;
  Symbol symbol_00;
  Symbol symbol_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  Message *local_d8;
  DescriptorBuilder *local_d0;
  undefined1 local_c8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  size_type local_40 [2];
  
  pFVar7 = this->file_;
  symbol_00._4_4_ = 0;
  symbol_00.type = symbol.type;
  symbol_00.field_1.descriptor = symbol.field_1.descriptor;
  local_d8 = proto;
  local_d0 = (DescriptorBuilder *)name;
  bVar3 = DescriptorPool::Tables::AddSymbol(this->tables_,full_name,symbol_00);
  if (bVar3) {
    if (parent != (void *)0x0) {
      pFVar7 = (FileDescriptor *)parent;
    }
    symbol_01._4_4_ = 0;
    symbol_01.type = symbol.type;
    symbol_01.field_1.descriptor = symbol.field_1.descriptor;
    bVar3 = FileDescriptorTables::AddAliasUnderParent
                      (this->file_tables_,pFVar7,(string *)local_d0,symbol_01);
    if (!bVar3) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                 ,0xb30);
      pLVar5 = internal::LogMessage::operator<<((LogMessage *)local_c8,"\"");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,full_name);
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,
                          "\" not previously defined in symbols_by_name_, but was defined in symbols_by_parent_; this shouldn\'t be possible."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_118,pLVar5);
      internal::LogMessage::~LogMessage((LogMessage *)local_c8);
      return false;
    }
    return true;
  }
  __s1 = (full_name->_M_dataplus)._M_p;
  cVar14 = *__s1;
  if (cVar14 == '\0') {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    pcVar16 = __s1;
    do {
      pcVar16 = pcVar16 + 1;
      uVar6 = (long)cVar14 + uVar6 * 5;
      cVar14 = *pcVar16;
    } while (cVar14 != '\0');
  }
  pp_Var1 = (this->tables_->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_buckets;
  uVar2 = (this->tables_->symbols_by_name_).
          super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_bucket_count;
  p_Var15 = pp_Var1[uVar6 % uVar2];
  p_Var17 = (_Node *)0x0;
  local_d0 = this;
  if (p_Var15 != (_Node *)0x0) {
    do {
      iVar4 = strcmp(__s1,(p_Var15->_M_v).first);
      p_Var17 = p_Var15;
      if (iVar4 == 0) break;
      p_Var15 = p_Var15->_M_next;
      p_Var17 = (_Node *)0x0;
    } while (p_Var15 !=
             (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
              *)0x0);
  }
  if (p_Var17 == (_Node *)0x0) {
    p_Var17 = pp_Var1[uVar2];
  }
  pSVar11 = &(p_Var17->_M_v).second;
  if (p_Var17 == pp_Var1[uVar2]) {
    pSVar11 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
  }
  local_c8._8_8_ = pSVar11->field_1;
  local_c8._0_4_ = pSVar11->type;
  pFVar7 = anon_unknown_1::Symbol::GetFile((Symbol *)local_c8);
  this_00 = local_d0;
  if (pFVar7 != local_d0->file_) {
    std::operator+(&local_90,"\"",full_name);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    puVar12 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar12) {
      local_e8 = *puVar12;
      lStack_e0 = plVar8[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar12;
      local_f8 = (ulong *)*plVar8;
    }
    local_f0 = plVar8[1];
    *plVar8 = (long)puVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,**(ulong **)pFVar7);
    psVar13 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_118.field_2._M_allocated_capacity = *psVar13;
      local_118.field_2._8_8_ = puVar10[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar13;
      local_118._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_118._M_string_length = puVar10[1];
    *puVar10 = psVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar13 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar13) {
      local_c8._16_8_ = *psVar13;
      local_c8._24_8_ = plVar8[3];
      local_c8._0_8_ = local_c8 + 0x10;
    }
    else {
      local_c8._16_8_ = *psVar13;
      local_c8._0_8_ = (size_type *)*plVar8;
    }
    local_c8._8_8_ = *(anon_union_8_7_bfa3a334_for_Symbol_2 *)(plVar8 + 1);
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    AddError(this_00,full_name,local_d8,NAME,(string *)local_c8);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    local_40[0] = local_90.field_2._M_allocated_capacity;
    local_50[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return false;
    }
    goto LAB_001d6ec4;
  }
  lVar9 = std::__cxx11::string::rfind((char)full_name,0x2e);
  if (lVar9 == -1) {
    std::operator+(&local_118,"\"",full_name);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar13 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar13) {
      local_c8._16_8_ = *psVar13;
      local_c8._24_8_ = plVar8[3];
      local_c8._0_8_ = local_c8 + 0x10;
    }
    else {
      local_c8._16_8_ = *psVar13;
      local_c8._0_8_ = (size_type *)*plVar8;
    }
    local_c8._8_8_ = *(anon_union_8_7_bfa3a334_for_Symbol_2 *)(plVar8 + 1);
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    AddError(this_00,full_name,local_d8,NAME,(string *)local_c8);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    local_40[0] = local_118.field_2._M_allocated_capacity;
    local_50[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) {
      return false;
    }
    goto LAB_001d6ec4;
  }
  std::__cxx11::string::substr((ulong)local_50,(ulong)full_name);
  puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x241aa3);
  psVar13 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_90.field_2._M_allocated_capacity = *psVar13;
    local_90.field_2._8_8_ = puVar10[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar13;
    local_90._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_90._M_string_length = puVar10[1];
  *puVar10 = psVar13;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_e8 = *puVar12;
    lStack_e0 = plVar8[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar12;
    local_f8 = (ulong *)*plVar8;
  }
  local_f0 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::substr((ulong)&local_70,(ulong)full_name);
  uVar6 = 0xf;
  if (local_f8 != &local_e8) {
    uVar6 = local_e8;
  }
  if (uVar6 < (ulong)(local_68 + local_f0)) {
    uVar6 = 0xf;
    if (local_70 != local_60) {
      uVar6 = local_60[0];
    }
    if (uVar6 < (ulong)(local_68 + local_f0)) goto LAB_001d6ceb;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_f8);
  }
  else {
LAB_001d6ceb:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_70);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  psVar13 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_118.field_2._M_allocated_capacity = *psVar13;
    local_118.field_2._8_8_ = puVar10[3];
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar13;
    local_118._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_118._M_string_length = puVar10[1];
  *puVar10 = psVar13;
  puVar10[1] = 0;
  *(undefined1 *)psVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar13) {
    local_c8._16_8_ = *psVar13;
    local_c8._24_8_ = plVar8[3];
    local_c8._0_8_ = local_c8 + 0x10;
  }
  else {
    local_c8._16_8_ = *psVar13;
    local_c8._0_8_ = (size_type *)*plVar8;
  }
  local_c8._8_8_ = *(anon_union_8_7_bfa3a334_for_Symbol_2 *)(plVar8 + 1);
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AddError(this_00,full_name,local_d8,NAME,(string *)local_c8);
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40) {
    return false;
  }
LAB_001d6ec4:
  operator_delete(local_50[0],local_40[0] + 1);
  return false;
}

Assistant:

bool DescriptorBuilder::AddSymbol(
    const string& full_name, const void* parent, const string& name,
    const Message& proto, Symbol symbol) {
  // If the caller passed NULL for the parent, the symbol is at file scope.
  // Use its file as the parent instead.
  if (parent == NULL) parent = file_;

  if (tables_->AddSymbol(full_name, symbol)) {
    if (!file_tables_->AddAliasUnderParent(parent, name, symbol)) {
      GOOGLE_LOG(DFATAL) << "\"" << full_name << "\" not previously defined in "
                     "symbols_by_name_, but was defined in symbols_by_parent_; "
                     "this shouldn't be possible.";
      return false;
    }
    return true;
  } else {
    const FileDescriptor* other_file = tables_->FindSymbol(full_name).GetFile();
    if (other_file == file_) {
      string::size_type dot_pos = full_name.find_last_of('.');
      if (dot_pos == string::npos) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name + "\" is already defined.");
      } else {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name.substr(dot_pos + 1) +
                 "\" is already defined in \"" +
                 full_name.substr(0, dot_pos) + "\".");
      }
    } else {
      // Symbol seems to have been defined in a different file.
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
               "\"" + full_name + "\" is already defined in file \"" +
               other_file->name() + "\".");
    }
    return false;
  }
}